

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O1

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_join_cluster_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _func_int *p_Var3;
  pointer psVar4;
  long *plVar5;
  long lVar6;
  _func_int **pp_Var7;
  pointer psVar8;
  int iVar9;
  element_type *peVar10;
  buffer *buf;
  long in_RDX;
  undefined **ppuVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  ptr<cluster_config> pVar12;
  ptr<resp_msg> pVar13;
  Param follower_param;
  ptr<cluster_config> c_config;
  uint64_t my_term;
  string local_68;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  undefined4 local_34;
  _Alloc_hider local_30;
  
  p_Var3 = req[9].super_msg_base._vptr_msg_base[1];
  uVar1 = *(undefined4 *)(in_RDX + 0x14);
  this->_vptr_raft_server = (_func_int **)0x0;
  peVar10 = (element_type *)operator_new(0xb0);
  (peVar10->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar10->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c4200;
  uVar2 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (peVar10->bg_commit_thread_)._M_id._M_thread = (native_handle_type)p_Var3;
  *(undefined4 *)&(peVar10->bg_append_thread_)._M_id._M_thread = 0xd;
  *(undefined4 *)((long)&(peVar10->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
  *(undefined4 *)&peVar10->bg_append_ea_ = uVar1;
  ppuVar11 = &PTR__resp_msg_005c4250;
  (peVar10->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_005c4250;
  (peVar10->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar10->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar10->votes_responded_ = 0;
  peVar10->votes_granted_ = 0;
  (peVar10->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)((long)&(peVar10->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18)
       = 0;
  *(undefined8 *)((long)&(peVar10->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20)
       = 0;
  *(undefined8 *)((long)&(peVar10->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)((long)&(peVar10->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)&(peVar10->priority_change_timer_).first_event_fired_ = 0;
  (peVar10->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  (peVar10->priority_change_timer_).t_created_.__d.__r = 0;
  (peVar10->priority_change_timer_).duration_us_ = 0;
  *(undefined4 *)&(peVar10->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar10->initialized_ = (__atomic_base<bool>)0x0;
  *(undefined3 *)&peVar10->field_0x31 = 0;
  peVar10->leader_ = (__atomic_base<int>)0x0;
  peVar10->id_ = 0;
  peVar10->my_priority_ = 0;
  *(undefined1 *)&peVar10->target_priority_ = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar10;
  this->_vptr_raft_server =
       (_func_int **)
       &(peVar10->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if ((*(long *)(in_RDX + 0x40) - (long)*(long **)(in_RDX + 0x38) == 0x10) &&
     (*(char *)(**(long **)(in_RDX + 0x38) + 8) == '\x02')) {
    psVar8 = req[2].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((((ulong)psVar8 & 0x10000) != 0) &&
       (psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage, psVar4 != (pointer)0x0)) {
      iVar9 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      if (2 < iVar9) {
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  (&local_68,
                   "this server is already in log syncing mode, but let\'s do it again: sm idx %lu, quick commit idx %lu, will not reset commit index"
                   ,req[2].super_msg_base.term_,req[2].super_msg_base._vptr_msg_base);
        (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar4,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_join_cluster_req",0xa2,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_) !=
            &local_68.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_))
          ;
        }
      }
    }
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar4 != (pointer)0x0) {
      iVar9 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      if (3 < iVar9) {
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  (&local_68,"got join cluster req from leader %d",(ulong)*(uint *)(in_RDX + 0x14));
        (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar4,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_join_cluster_req",0xa6,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_) !=
            &local_68.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_))
          ;
        }
      }
    }
    LOCK();
    *(undefined1 *)
     ((long)&req[2].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 1;
    UNLOCK();
    LOCK();
    *(undefined4 *)
     &req[8].log_entries_.
      super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = 1;
    UNLOCK();
    LOCK();
    *(undefined4 *)((long)&req->commit_idx_ + 4) = *(undefined4 *)(in_RDX + 0x14);
    UNLOCK();
    if (((ulong)psVar8 & 0x10000) == 0) {
      LOCK();
      req[2].super_msg_base.term_ = *(ulong *)&req[2].super_msg_base.dst_;
      UNLOCK();
      LOCK();
      req[2].super_msg_base._vptr_msg_base = *(_func_int ***)&req[2].super_msg_base.dst_;
      UNLOCK();
    }
    LOCK();
    *(undefined4 *)(req[9].super_msg_base._vptr_msg_base + 2) = 0xffffffff;
    UNLOCK();
    LOCK();
    req[9].super_msg_base._vptr_msg_base[1] = *(_func_int **)(in_RDX + 8);
    UNLOCK();
    plVar5 = (long *)**(undefined8 **)&req[4].super_msg_base.dst_;
    (**(code **)(*plVar5 + 0x20))(plVar5,req[9].super_msg_base._vptr_msg_base);
    local_68._M_dataplus._M_p._0_4_ =
         *(undefined4 *)
          &(req->log_entries_).
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    local_68._M_dataplus._M_p._4_4_ = *(undefined4 *)((long)&req->commit_idx_ + 4);
    local_68._M_string_length._0_4_ = 0xffffffff;
    local_30._M_p = (pointer)req[9].super_msg_base._vptr_msg_base[1];
    local_68.field_2._M_allocated_capacity = (size_type)&stack0xffffffffffffffd0;
    lVar6 = *(long *)&req[4].super_msg_base.dst_;
    if (*(long *)(lVar6 + 0x80) != 0) {
      local_34 = 0xb;
      local_48 = (element_type *)&local_68;
      (**(code **)(lVar6 + 0x88))(lVar6 + 0x70);
    }
    buf = log_entry::get_buf((log_entry *)**(undefined8 **)(in_RDX + 0x38));
    pVar12 = cluster_config::deserialize((cluster_config *)&stack0xffffffffffffffb8,buf);
    plVar5 = (long *)**(undefined8 **)&req[4].super_msg_base.dst_;
    (**(code **)(*plVar5 + 0x18))
              (plVar5,local_48,
               pVar12.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    reconfigure((raft_server *)req,(ptr<cluster_config> *)&stack0xffffffffffffffb8);
    pp_Var7 = this->_vptr_raft_server;
    pp_Var7[4] = (_func_int *)((long)req[2].super_msg_base._vptr_msg_base + 1);
    *(undefined1 *)(pp_Var7 + 6) = 1;
    ppuVar11 = (undefined **)extraout_RDX;
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
      ppuVar11 = (undefined **)extraout_RDX_00;
    }
  }
  else {
    psVar8 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar8 != (pointer)0x0) {
      iVar9 = (*(code *)(psVar8->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      ppuVar11 = (undefined **)extraout_RDX_01;
      if (3 < iVar9) {
        psVar8 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  (&local_68,
                   "receive an invalid JoinClusterRequest as the log entry value doesn\'t meet the requirements"
                  );
        (*(code *)(psVar8->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar8,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_join_cluster_req",0x94,&local_68);
        ppuVar11 = (undefined **)extraout_RDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_) !=
            &local_68.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_))
          ;
          ppuVar11 = (undefined **)extraout_RDX_03;
        }
      }
    }
  }
  pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar11;
  pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_join_cluster_req(req_msg& req) {
    std::vector<ptr<log_entry>>& entries = req.log_entries();
    ptr<resp_msg> resp = cs_new<resp_msg>
                         ( state_->get_term(),
                           msg_type::join_cluster_response,
                           id_,
                           req.get_src() );
    if ( entries.size() != 1 ||
         entries[0]->get_val_type() != log_val_type::conf ) {
        p_in("receive an invalid JoinClusterRequest as the log entry value "
             "doesn't meet the requirements");
        return resp;
    }

    // MONSTOR-8244:
    //   Adding server may be called multiple times while previous process is
    //   in progress. It should gracefully handle the new request and should
    //   not ruin the current request.
    bool reset_commit_idx = true;
    if (catching_up_) {
        p_wn("this server is already in log syncing mode, "
             "but let's do it again: sm idx %" PRIu64 ", quick commit idx %" PRIu64 ", "
             "will not reset commit index",
             sm_commit_index_.load(),
             quick_commit_index_.load());
        reset_commit_idx = false;
    }

    p_in("got join cluster req from leader %d", req.get_src());
    catching_up_ = true;
    role_ = srv_role::follower;
    leader_ = req.get_src();

    if (reset_commit_idx) {
        // MONSTOR-7503: We should not reset it to 0.
        sm_commit_index_.store( initial_commit_index_ );
        quick_commit_index_.store( initial_commit_index_ );
    }

    state_->set_voted_for(-1);
    state_->set_term(req.get_term());
    ctx_->state_mgr_->save_state(*state_);

    cb_func::Param follower_param(id_, leader_);
    uint64_t my_term = state_->get_term();
    follower_param.ctx = &my_term;
    (void) ctx_->cb_func_.call(cb_func::BecomeFollower, &follower_param);

    ptr<cluster_config> c_config = cluster_config::deserialize(entries[0]->get_buf());
    // WARNING: We should make cluster config durable here. Otherwise, if
    //          this server gets restarted before receiving the first
    //          committed config (the first config that includes this server),
    //          this server will remove itself immediately by replaying
    //          previous config which does not include this server.
    ctx_->state_mgr_->save_config(*c_config);
    reconfigure(c_config);

    resp->accept( quick_commit_index_.load() + 1 );
    return resp;
}